

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalUnixMakefileGenerator3.cxx
# Opt level: O2

string * __thiscall
cmGlobalUnixMakefileGenerator3::ConvertToMakefilePath
          (string *__return_storage_ptr__,cmGlobalUnixMakefileGenerator3 *this,string *path)

{
  char cVar1;
  pointer pcVar2;
  size_type sVar3;
  size_type sVar4;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  pcVar2 = (path->_M_dataplus)._M_p;
  sVar3 = path->_M_string_length;
  sVar4 = 0;
  do {
    if (sVar3 == sVar4) {
      return __return_storage_ptr__;
    }
    cVar1 = pcVar2[sVar4];
    if ((cVar1 == ' ') || (cVar1 == '#')) {
LAB_0030e54a:
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
LAB_0030e555:
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
    }
    else {
      if (cVar1 != '$') {
        if (cVar1 == '\\') goto LAB_0030e54a;
        if (cVar1 == '=') goto LAB_0030e540;
        goto LAB_0030e555;
      }
LAB_0030e540:
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    sVar4 = sVar4 + 1;
  } while( true );
}

Assistant:

std::string cmGlobalUnixMakefileGenerator3::ConvertToMakefilePath(
  std::string const& path) const
{
#if defined(_WIN32) && !defined(__CYGWIN__)
  if (!this->ForceUnixPaths) {
    return ConvertToMakefilePathForWindows(path);
  }
#endif
  return ConvertToMakefilePathForUnix(path);
}